

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void void_pthread_rwlock_wrlock(void *mu)

{
  int *piVar1;
  unique_lock<std::mutex> uStack_20;
  
  uStack_20._M_device = (mutex_type *)(*mu + 8);
  uStack_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&uStack_20);
  while (piVar1 = *mu, *piVar1 != 0) {
    std::condition_variable::wait((unique_lock *)(piVar1 + 0xc));
  }
  *piVar1 = -1;
  std::unique_lock<std::mutex>::unlock(&uStack_20);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_20);
  return;
}

Assistant:

static void void_pthread_rwlock_wrlock (void *mu) {
	pthread_rwlock_wrlock ((pthread_rwlock_t *) mu);
}